

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O1

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *v;
  long lVar1;
  pointer pvVar2;
  bool bVar3;
  undefined1 auVar4 [8];
  int iVar5;
  uint uVar6;
  undefined8 uVar7;
  unsigned_long uVar8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
  *this_00;
  ulong uVar9;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  h;
  number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
  local_1c3;
  number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>
  local_1c2;
  int_<2> local_1c1;
  ulong local_1c0;
  pthread_mutex_t *local_1b8;
  cpp_dec_float<100U,_int,_void> *local_1b0;
  undefined1 local_1a8 [8];
  type pnStack_1a0;
  uint local_198 [11];
  undefined3 uStack_16b;
  int iStack_168;
  bool bStack_164;
  undefined8 local_160;
  undefined1 local_158 [16];
  cpp_dec_float<100U,_int,_void> *local_148;
  uint auStack_140 [2];
  cpp_dec_float<100U,_int,_void> *local_138;
  uint auStack_130 [2];
  uint local_128 [2];
  uint auStack_120 [2];
  int local_118;
  bool local_114;
  fpclass_type local_110;
  int32_t iStack_10c;
  long local_108;
  long local_100;
  cpp_dec_float<100U,_int,_void> local_f8;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointtanh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>,_void,_void>
  local_a0;
  undefined1 local_80 [16];
  uint local_70 [2];
  uint auStack_68 [2];
  uint local_60 [2];
  uint auStack_58 [2];
  uint local_50 [4];
  int local_40;
  bool local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  local_1b8 = (pthread_mutex_t *)&this->m_mutex;
  iVar5 = pthread_mutex_lock(local_1b8);
  if (iVar5 != 0) {
    uVar7 = std::__throw_system_error(iVar5);
    __cxa_guard_abort(&constants::detail::
                       constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                       ::get_from_string()::result);
    pthread_mutex_unlock(local_1b8);
    _Unwind_Resume(uVar7);
  }
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar6 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<100U,_int,_void> *)local_158,1,(type *)0x0);
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 0x10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.data._M_elems[10] = 0;
    local_f8.data._M_elems[0xb] = 0;
    local_f8.data._M_elems[0xc] = 0;
    local_f8.data._M_elems[0xd] = 0;
    local_f8.data._M_elems._56_5_ = 0;
    local_f8.data._M_elems[0xf]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    local_1c0 = (ulong)uVar6;
    multiprecision::detail::
    number_kind_floating_pointldexp_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
    ::operator()(&local_1c3,&local_f8,(cpp_dec_float<100U,_int,_void> *)local_158,-uVar6);
    v = &this->m_t_max;
    local_158._0_8_ = local_1a8;
    auStack_140[0] = 2;
    local_158._8_8_ = v;
    local_148 = &local_f8;
    local_138 = &local_f8;
    iVar5 = multiprecision::
            itrunc<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,int,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>,void,void,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                      ((expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_floating_pointceil_funct<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>_>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::divides,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_void,_void>,_void,_void>
                        *)local_158,
                       (policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>
                        *)local_1a8);
    uVar9 = local_1c0;
    local_108 = local_1c0 * 3;
    lVar1 = local_1c0 * 0x18;
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_abscissas).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + local_1c0,(long)iVar5);
    std::
    vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ::reserve((this->m_weights).
              super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar9,(long)iVar5);
    auStack_120[1]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
    auStack_120._0_5_ = local_f8.data._M_elems._56_5_;
    local_128[0] = local_f8.data._M_elems[0xc];
    local_128[1] = local_f8.data._M_elems[0xd];
    local_138 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._32_8_;
    auStack_130[0] = local_f8.data._M_elems[10];
    auStack_130[1] = local_f8.data._M_elems[0xb];
    local_148 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._16_8_;
    auStack_140[0] = local_f8.data._M_elems[6];
    auStack_140[1] = local_f8.data._M_elems[7];
    local_158._0_4_ = local_f8.data._M_elems[0];
    local_158._4_4_ = local_f8.data._M_elems[1];
    local_158._8_4_ = local_f8.data._M_elems[2];
    local_158._12_4_ = local_f8.data._M_elems[3];
    local_118 = local_f8.exp;
    local_114 = local_f8.neg;
    local_110 = local_f8.fpclass;
    iStack_10c = local_f8.prec_elem;
    uVar8 = 0;
    local_100 = lVar1;
    if ((local_f8.fpclass != cpp_dec_float_NaN) &&
       ((this->m_t_max).m_backend.fpclass != cpp_dec_float_NaN)) {
      local_1b0 = &(this->m_t_crossover).m_backend;
      uVar8 = 0;
      while (iVar5 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_158,&v->m_backend),
            iVar5 < 0) {
        if (local_110 == cpp_dec_float_NaN) {
          uVar9 = 0;
        }
        else {
          uVar9 = 0;
          if ((this->m_t_crossover).m_backend.fpclass != cpp_dec_float_NaN) {
            uVar6 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_158,local_1b0);
            uVar9 = (ulong)(uVar6 >> 0x1f);
          }
        }
        this_00 = (vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                   *)((long)&(((this->m_abscissas).
                               super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                             )._M_impl + local_100);
        if (((local_110 == cpp_dec_float_NaN) ||
            ((this->m_t_crossover).m_backend.fpclass == cpp_dec_float_NaN)) ||
           (iVar5 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_158,local_1b0), -1 < iVar5))
        {
          abscissa_complement_at_t
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)local_80,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                      *)local_158);
          local_1a8 = (undefined1  [8])local_80._0_8_;
          auVar4 = local_1a8;
          pnStack_1a0 = (type)local_80._8_8_;
          local_198[8] = local_50[0];
          local_198[9] = local_50[1];
          stack0xfffffffffffffe90 = (undefined5)local_50._8_8_;
          uStack_16b = SUB83(local_50._8_8_,5);
          local_198[4] = local_60[0];
          local_198[5] = local_60[1];
          local_198[6] = auStack_58[0];
          local_198[7] = auStack_58[1];
          local_198[0] = local_70[0];
          local_198[1] = local_70[1];
          local_198[2] = auStack_68[0];
          local_198[3] = auStack_68[1];
          iStack_168 = local_40;
          bStack_164 = local_3c;
          local_160._0_4_ = local_38;
          local_160._4_4_ = iStack_34;
          local_1a8._0_4_ = (undefined4)local_80._0_8_;
          bVar3 = local_1a8._0_4_ != 0;
          local_1a8 = auVar4;
          if ((fpclass_type)_local_38 != cpp_dec_float_finite || bVar3) {
            bStack_164 = (bool)(local_3c ^ 1);
          }
        }
        else {
          if ((constants::detail::
               constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
               ::get_from_string()::result == '\0') &&
             (iVar5 = __cxa_guard_acquire(&constants::detail::
                                           constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                                           ::get_from_string()::result), iVar5 != 0)) {
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._72_8_ = 0x1000000000;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._0_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._8_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._16_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._24_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._32_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._40_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._48_8_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._56_5_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._61_3_ = 0;
            constants::detail::
            constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
            ::get_from_string()::result._64_5_ = 0;
            multiprecision::backends::cpp_dec_float<100U,_int,_void>::rd_string
                      ((cpp_dec_float<100U,_int,_void> *)
                       constants::detail::
                       constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                       ::get_from_string()::result,
                       "1.57079632679489661923132169163975144209858469968755291048747229615390820314310449931401741267105853399107404326e+00"
                      );
            __cxa_guard_release(&constants::detail::
                                 constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                                 ::get_from_string()::result);
          }
          local_a0.arg1 = (type)&local_1c1;
          local_a0.arg2.arg1 =
               (type)constants::detail::
                     constant_half_pi<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                     ::get_from_string()::result;
          local_a0.arg2.arg2.arg1 = &local_1c2;
          local_160._0_4_ = cpp_dec_float_finite;
          local_160._4_4_ = 0x10;
          local_1a8 = (undefined1  [8])0x0;
          pnStack_1a0 = (type)0x0;
          local_198[0] = 0;
          local_198[1] = 0;
          local_198[2] = 0;
          local_198[3] = 0;
          local_198[4] = 0;
          local_198[5] = 0;
          local_198[6] = 0;
          local_198[7] = 0;
          local_198[8] = 0;
          local_198[9] = 0;
          stack0xfffffffffffffe90 = 0;
          uStack_16b = 0;
          iStack_168 = 0;
          bStack_164 = false;
          local_a0.arg2.arg2.arg2 = (type)local_158;
          multiprecision::
          number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
          ::
          do_assign_function<boost::multiprecision::detail::expression<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointtanh_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::detail::expression<boost::multiprecision::detail::multiplies,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::detail::expression<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_floating_pointsinh_funct<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>,void,void>,void,void>>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)local_1a8,&local_a0,(int_<2> *)local_a0.arg1);
        }
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
        ::
        emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  (this_00,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                            *)local_1a8);
        local_1a8._0_4_ = 2;
        pnStack_1a0 = (type)&local_f8;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)local_158,
                     (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)local_1a8);
        uVar8 = uVar8 + uVar9;
        if ((local_110 == cpp_dec_float_NaN) ||
           ((this->m_t_max).m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
    }
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[local_1c0] = uVar8;
    auStack_120[1]._1_3_ = local_f8.data._M_elems[0xf]._1_3_;
    auStack_120._0_5_ = local_f8.data._M_elems._56_5_;
    local_128[0] = local_f8.data._M_elems[0xc];
    local_128[1] = local_f8.data._M_elems[0xd];
    local_138 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._32_8_;
    auStack_130[0] = local_f8.data._M_elems[10];
    auStack_130[1] = local_f8.data._M_elems[0xb];
    local_148 = (cpp_dec_float<100U,_int,_void> *)local_f8.data._M_elems._16_8_;
    auStack_140[0] = local_f8.data._M_elems[6];
    auStack_140[1] = local_f8.data._M_elems[7];
    local_158._0_4_ = local_f8.data._M_elems[0];
    local_158._4_4_ = local_f8.data._M_elems[1];
    local_158._8_4_ = local_f8.data._M_elems[2];
    local_158._12_4_ = local_f8.data._M_elems[3];
    local_118 = local_f8.exp;
    local_114 = local_f8.neg;
    local_110 = local_f8.fpclass;
    iStack_10c = local_f8.prec_elem;
    if ((local_f8.fpclass != cpp_dec_float_NaN) &&
       ((this->m_t_max).m_backend.fpclass != cpp_dec_float_NaN)) {
      while (iVar5 = multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               ((cpp_dec_float<100U,_int,_void> *)local_158,&v->m_backend),
            iVar5 < 0) {
        pvVar2 = (this->m_weights).
                 super__Vector_base<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>,_std::allocator<std::vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        weight_at_t((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)local_1a8,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)local_158);
        std::
        vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
        ::
        emplace_back<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
                  ((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>,std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                    *)((long)&(pvVar2->
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
                              )._M_impl.super__Vector_impl_data + local_108 * 8),
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)local_1a8);
        local_1a8._0_4_ = 2;
        pnStack_1a0 = (type)&local_f8;
        multiprecision::
        number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
        ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>
                      *)local_158,
                     (expression<boost::multiprecision::detail::multiply_immediates,_int,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                      *)local_1a8);
        if ((local_110 == cpp_dec_float_NaN) ||
           ((this->m_t_max).m_backend.fpclass == cpp_dec_float_NaN)) break;
      }
    }
  }
  pthread_mutex_unlock(local_1b8);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }